

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

TypeMetaFunction * __thiscall
soul::StructuralParser::parseTypeMetaFunction(StructuralParser *this,Context *context,Op op)

{
  Expression *type;
  PoolItem *pPVar1;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2af3de);
  type = parseType(this,metaFunctionArgument);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
  pPVar1 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
  AST::TypeMetaFunction::TypeMetaFunction((TypeMetaFunction *)&pPVar1->item,context,type,op);
  pPVar1->destructor =
       PoolAllocator::
       allocate<soul::AST::TypeMetaFunction,_const_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::TypeMetaFunction::Op_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeMetaFunction *)&pPVar1->item;
}

Assistant:

AST::TypeMetaFunction& parseTypeMetaFunction (const AST::Context& context, AST::TypeMetaFunction::Op op)
    {
        expect (Operator::openParen);
        auto& t = parseType (ParseTypeContext::metaFunctionArgument);
        expect (Operator::closeParen);
        return allocate<AST::TypeMetaFunction> (context, t, op);
    }